

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSkip.cpp
# Opt level: O1

void __thiscall NaPNSkip::post_action(NaPNSkip *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  NaVector *pNVar4;
  undefined4 extraout_var;
  
  NaPetriCnInput::commit_data(&this->in);
  uVar1 = NaPetriNode::activations(&this->super_NaPetriNode);
  if (this->nSkip < uVar1) {
    NaPetriCnOutput::commit_data(&this->out);
  }
  uVar2 = NaPetriNode::activations(&this->super_NaPetriNode);
  uVar1 = this->nSkip;
  pNVar4 = NaPetriCnOutput::data(&this->sync);
  iVar3 = (*pNVar4->_vptr_NaVector[8])(pNVar4,0);
  *(undefined8 *)CONCAT44(extraout_var,iVar3) =
       *(undefined8 *)(&DAT_0015fca8 + (ulong)(uVar1 < uVar2) * 8);
  NaPetriCnOutput::commit_data(&this->sync);
  return;
}

Assistant:

void
NaPNSkip::post_action ()
{
  // Commit input anyway to get next data portion
  in.commit_data();

  if(activations() > nSkip)
    // Commit output only if given number of portions were skipped
    out.commit_data();

  if(activations() > nSkip)
    sync.data()[0] = 1;
  else
    sync.data()[0] = -1;

  // Commit synchronization
  sync.commit_data();
}